

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

void link_stream(st_quicly_default_scheduler_state_t *sched,quicly_stream_t *stream,
                int conn_is_blocked)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  quicly_linklist_t *in_RDI;
  quicly_linklist_t *slot;
  quicly_linklist_t *in_stack_ffffffffffffffd8;
  quicly_linklist_t *prev;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)(in_RSI + 0x110));
  if (iVar1 == 0) {
    prev = in_RDI;
    if (in_EDX != 0) {
      iVar1 = quicly_stream_can_send
                        ((quicly_stream_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                         (int)((ulong)in_RDI >> 0x20));
      if (iVar1 == 0) {
        prev = in_RDI + 1;
      }
    }
    quicly_linklist_insert(prev,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void link_stream(struct st_quicly_default_scheduler_state_t *sched, quicly_stream_t *stream, int conn_is_blocked)
{
    if (!quicly_linklist_is_linked(&stream->_send_aux.pending_link.default_scheduler)) {
        quicly_linklist_t *slot = &sched->active;
        if (conn_is_blocked && !quicly_stream_can_send(stream, 0))
            slot = &sched->blocked;
        quicly_linklist_insert(slot->prev, &stream->_send_aux.pending_link.default_scheduler);
    }
}